

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

_Bool av1_compute_global_motion_disflow
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  double *flow;
  int iVar1;
  int iVar2;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  PyramidLayer *pPVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  long lVar6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  FlowField *flow_00;
  double *pdVar10;
  ulong uVar11;
  Correspondence *matched_points;
  uint uVar12;
  double *flow_01;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int i;
  double *pdVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  void *local_f0;
  double *local_e0;
  double local_c8;
  double flow_u;
  MotionModel *local_b8;
  double *local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  double v_kernel [4];
  double h_kernel [4];
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  local_b8 = motion_models;
  uVar8 = aom_compute_pyramid(src,bit_depth,0xc,pyr);
  iVar9 = aom_compute_pyramid(ref,bit_depth,0xc,pyr_00);
  if ((((int)uVar8 < 0) || (iVar9 < 0)) ||
     (_Var7 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), !_Var7)) {
LAB_0025391d:
    *mem_alloc_failed = true;
    return false;
  }
  iVar9 = pyr->layers->width;
  iVar15 = pyr->layers->height;
  flow_00 = (FlowField *)aom_malloc(0x28);
  if (flow_00 == (FlowField *)0x0) goto LAB_0025391d;
  iVar9 = iVar9 >> 3;
  flow_00->width = iVar9;
  iVar15 = iVar15 >> 3;
  flow_00->height = iVar15;
  iVar9 = iVar9 + 4;
  flow_00->stride = iVar9;
  lVar21 = (long)(iVar15 + 4) * (long)iVar9;
  pdVar10 = (double *)aom_calloc(lVar21 * 2,8);
  flow_00->buf0 = pdVar10;
  if (pdVar10 == (double *)0x0) {
    aom_free(flow_00);
    goto LAB_0025391d;
  }
  lVar24 = (long)(flow_00->stride * 2);
  flow = pdVar10 + lVar24 + 2;
  flow_00->u = flow;
  flow_01 = pdVar10 + lVar24 + lVar21 + 2;
  flow_00->v = flow_01;
  if (uVar8 < 2) {
    local_e0 = (double *)0x0;
    local_f0 = (void *)0x0;
  }
  else {
    local_f0 = aom_malloc((long)(((pyr->layers[1].height >> 3) + 4) * flow_00->stride) << 3);
    if (local_f0 == (void *)0x0) {
      _Var7 = false;
      aom_free((void *)0x0);
      *mem_alloc_failed = true;
      goto LAB_00253ede;
    }
    local_e0 = (double *)((long)flow_00->stride * 0x10 + (long)local_f0);
  }
  lVar6 = lVar24 * 8 + 0x10;
  local_b0 = pdVar10 + lVar24 + lVar21 + 2;
  local_a8 = lVar21 * 8;
  uVar14 = (ulong)uVar8;
  while (1 < (int)uVar14) {
    local_80 = uVar14 - 1;
    pPVar3 = pyr->layers;
    iVar9 = pPVar3[local_80].width;
    iVar15 = pPVar3[local_80].height;
    iVar19 = pPVar3[local_80].stride;
    puVar4 = pPVar3[local_80].buffer;
    puVar5 = pyr_00->layers[local_80].buffer;
    uVar8 = iVar9 >> 3;
    local_90 = (ulong)uVar8;
    uVar12 = iVar15 >> 3;
    local_98 = (ulong)uVar12;
    lVar21 = (long)flow_00->stride;
    uVar22 = 0;
    if (0 < (int)uVar8) {
      uVar22 = (ulong)uVar8;
    }
    uVar11 = 0;
    if (0 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    pdVar16 = flow_01;
    pdVar25 = flow;
    local_a0 = lVar21;
    local_88 = uVar14;
    for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      for (lVar26 = 0; uVar22 * 8 != lVar26; lVar26 = lVar26 + 8) {
        (*aom_compute_flow_at_point)
                  (puVar4,puVar5,(int)lVar26,(int)uVar13 * 8,iVar9,iVar15,iVar19,
                   (double *)((long)pdVar25 + lVar26),(double *)(lVar26 + (long)pdVar16));
      }
      pdVar16 = pdVar16 + lVar21;
      pdVar25 = pdVar25 + lVar21;
    }
    iVar19 = (int)local_90;
    iVar15 = (int)local_98;
    iVar17 = (int)local_a0;
    fill_flow_field_borders(flow,iVar19,iVar15,iVar17);
    fill_flow_field_borders(flow_01,iVar19,iVar15,iVar17);
    uVar8 = iVar15 * 2;
    iVar9 = flow_00->stride;
    upscale_flow_component(flow,iVar19,iVar15,iVar17,local_e0);
    upscale_flow_component(flow_01,iVar19,iVar15,iVar17,local_e0);
    iVar15 = pyr->layers[local_88 - 2].height;
    uVar12 = pyr->layers[local_88 - 2].width >> 3;
    if (iVar19 * 2 < (int)uVar12) {
      uVar14 = 0;
      if (0 < (int)uVar8) {
        uVar14 = (ulong)uVar8;
      }
      pdVar16 = pdVar10 + lVar24 + (long)(iVar19 * 2) + 2;
      while (bVar27 = uVar14 != 0, uVar14 = uVar14 - 1, bVar27) {
        *pdVar16 = pdVar16[-1];
        *(undefined8 *)((long)pdVar16 + local_a8) = *(undefined8 *)((long)pdVar16 + local_a8 + -8);
        pdVar16 = pdVar16 + iVar9;
      }
    }
    uVar14 = local_80;
    if ((int)uVar8 < iVar15 >> 3) {
      lVar21 = (long)(int)(uVar8 * iVar9);
      uVar22 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar22 = 0;
      }
      lVar26 = lVar21 * 8 + (long)iVar9 * -8;
      for (lVar18 = 0; uVar22 * 8 != lVar18; lVar18 = lVar18 + 8) {
        *(undefined8 *)((long)pdVar10 + lVar18 + lVar21 * 8 + lVar6) =
             *(undefined8 *)((long)pdVar10 + lVar18 + lVar26 + lVar6);
        *(undefined8 *)((long)local_b0 + lVar18 + lVar21 * 8) =
             *(undefined8 *)((long)local_b0 + lVar18 + lVar26);
      }
    }
  }
  aom_free(local_f0);
  matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5);
  if (matched_points == (Correspondence *)0x0) {
    *mem_alloc_failed = true;
    free_flow_field(flow_00);
    return false;
  }
  iVar9 = flow_00->width;
  iVar15 = flow_00->height;
  iVar19 = flow_00->stride;
  iVar17 = 0;
  for (lVar21 = 0; lVar21 < corners->num_corners; lVar21 = lVar21 + 1) {
    iVar1 = corners->corners[lVar21 * 2];
    uVar8 = iVar1 - 3;
    iVar20 = (int)uVar8 >> 3;
    if ((0 < iVar20) && (iVar20 + 2 < iVar9)) {
      iVar2 = corners->corners[lVar21 * 2 + 1];
      uVar12 = iVar2 - 3;
      iVar23 = (int)uVar12 >> 3;
      if ((0 < iVar23) && (iVar23 + 2 < iVar15)) {
        get_cubic_kernel_dbl((double)(uVar8 & 7) * 0.125,h_kernel);
        get_cubic_kernel_dbl((double)(uVar12 & 7) * 0.125,v_kernel);
        iVar20 = iVar23 * iVar19 + iVar20;
        flow_u = bicubic_interp_one(flow_00->u + iVar20,iVar19,h_kernel,v_kernel);
        local_c8 = bicubic_interp_one(flow_00->v + iVar20,iVar19,h_kernel,v_kernel);
        pPVar3 = pyr->layers;
        (*aom_compute_flow_at_point)
                  (pPVar3->buffer,pyr_00->layers->buffer,uVar8,uVar12,pPVar3->width,pPVar3->height,
                   pPVar3->stride,&flow_u,&local_c8);
        dVar28 = (double)iVar1;
        matched_points[iVar17].x = dVar28;
        dVar29 = (double)iVar2;
        matched_points[iVar17].y = dVar29;
        matched_points[iVar17].rx = dVar28 + flow_u;
        matched_points[iVar17].ry = dVar29 + local_c8;
        iVar17 = iVar17 + 1;
      }
    }
  }
  _Var7 = ransac(matched_points,iVar17,type,local_b8,num_motion_models,mem_alloc_failed);
  aom_free(matched_points);
LAB_00253ede:
  free_flow_field(flow_00);
  return _Var7;
}

Assistant:

bool av1_compute_global_motion_disflow(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  // Precompute information we will need about each frame
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;

  const int src_layers =
      aom_compute_pyramid(src, bit_depth, DISFLOW_PYRAMID_LEVELS, src_pyramid);
  const int ref_layers =
      aom_compute_pyramid(ref, bit_depth, DISFLOW_PYRAMID_LEVELS, ref_pyramid);

  if (src_layers < 0 || ref_layers < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  assert(src_layers == ref_layers);

  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);

  FlowField *flow = alloc_flow_field(src_width, src_height);
  if (!flow) {
    *mem_alloc_failed = true;
    return false;
  }

  if (!compute_flow_field(src_pyramid, ref_pyramid, src_layers, flow)) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  // find correspondences between the two images using the flow field
  Correspondence *correspondences =
      aom_malloc(src_corners->num_corners * sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  const int num_correspondences = determine_disflow_correspondence(
      src_pyramid, ref_pyramid, src_corners, flow, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  free_flow_field(flow);
  return result;
}